

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O0

void __thiscall
Secp256k1_TweakPrivkeySecp256k1EcTest_Test::TestBody
          (Secp256k1_TweakPrivkeySecp256k1EcTest_Test *this)

{
  bool bVar1;
  reference paVar2;
  char *pcVar3;
  AssertHelper local_1c0;
  Message local_1b8;
  string local_1b0;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_1;
  Message local_178;
  ByteData local_170;
  undefined1 local_158 [8];
  ByteData actual_mul;
  Message local_138;
  string local_130;
  undefined1 local_110 [8];
  AssertionResult gtest_ar;
  Message local_f8 [2];
  ByteData local_e8;
  undefined1 local_c0 [8];
  ByteData actual_add;
  TweakPrivkeyTestVector test_vector;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_> *__range1;
  Secp256k1 secp;
  secp256k1_context_struct *cxt;
  Secp256k1_TweakPrivkeySecp256k1EcTest_Test *this_local;
  
  secp.secp256k1_context_ = wally_get_secp_context();
  cfd::core::Secp256k1::Secp256k1((Secp256k1 *)&__range1,secp.secp256k1_context_);
  __end1 = std::vector<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>::begin
                     (&tweak_privkey_test_vectors);
  test_vector.expect_mul.field_2._8_8_ =
       std::vector<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>::end
                 (&tweak_privkey_test_vectors);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_TweakPrivkeyTestVector_*,_std::vector<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>_>
                                     *)((long)&test_vector.expect_mul.field_2 + 8)), bVar1) {
    paVar2 = __gnu_cxx::
             __normal_iterator<const_TweakPrivkeyTestVector_*,_std::vector<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>_>
             ::operator*(&__end1);
    anon_struct_112_4_5aca4469::TweakPrivkeyTestVector
              ((anon_struct_112_4_5aca4469 *)
               &actual_add.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,paVar2);
    cfd::core::ByteData::ByteData((ByteData *)local_c0);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::Secp256k1::AddTweakPrivkeySecp256k1Ec
                  (&local_e8,(Secp256k1 *)&__range1,
                   (ByteData *)
                   &actual_add.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (ByteData *)
                   &test_vector.privkey.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        cfd::core::ByteData::operator=((ByteData *)local_c0,&local_e8);
        cfd::core::ByteData::~ByteData(&local_e8);
      }
    }
    else {
      testing::Message::Message(local_f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                 ,0x15e,
                 "Expected: actual_add = secp.AddTweakPrivkeySecp256k1Ec(test_vector.privkey, test_vector.tweak) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      testing::Message::~Message(local_f8);
    }
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_130,(ByteData *)local_c0);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_110,"test_vector.expect_add","actual_add.GetHex()",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &test_vector.tweak.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
    if (!bVar1) {
      testing::Message::Message(&local_138);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &actual_mul.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                 ,0x15f,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &actual_mul.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_138);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &actual_mul.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_138);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
    cfd::core::ByteData::ByteData((ByteData *)local_158);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::Secp256k1::MulTweakPrivkeySecp256k1Ec
                  (&local_170,(Secp256k1 *)&__range1,
                   (ByteData *)
                   &actual_add.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (ByteData *)
                   &test_vector.privkey.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        cfd::core::ByteData::operator=((ByteData *)local_158,&local_170);
        cfd::core::ByteData::~ByteData(&local_170);
      }
    }
    else {
      testing::Message::Message(&local_178);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                 ,0x164,
                 "Expected: actual_mul = secp.MulTweakPrivkeySecp256k1Ec(test_vector.privkey, test_vector.tweak) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_178);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_178);
    }
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_1b0,(ByteData *)local_158);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_190,"test_vector.expect_mul","actual_mul.GetHex()",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&test_vector.expect_add.field_2 + 8),&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
    if (!bVar1) {
      testing::Message::Message(&local_1b8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                 ,0x165,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      testing::Message::~Message(&local_1b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
    cfd::core::ByteData::~ByteData((ByteData *)local_158);
    cfd::core::ByteData::~ByteData((ByteData *)local_c0);
    anon_struct_112_4_5aca4469::~TweakPrivkeyTestVector
              ((anon_struct_112_4_5aca4469 *)
               &actual_add.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<const_TweakPrivkeyTestVector_*,_std::vector<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

TEST(Secp256k1, TweakPrivkeySecp256k1EcTest) {
  struct secp256k1_context_struct *cxt = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(cxt);
  for (TweakPrivkeyTestVector test_vector : tweak_privkey_test_vectors) {
    ByteData actual_add;
    EXPECT_NO_THROW(
        actual_add = secp.AddTweakPrivkeySecp256k1Ec(test_vector.privkey,
            test_vector.tweak));
    EXPECT_EQ(test_vector.expect_add, actual_add.GetHex());

    ByteData actual_mul;
    EXPECT_NO_THROW(
        actual_mul = secp.MulTweakPrivkeySecp256k1Ec(test_vector.privkey,
            test_vector.tweak));
    EXPECT_EQ(test_vector.expect_mul, actual_mul.GetHex());
  }
}